

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::TrigramInfo::TrigramInfo(TrigramInfo *this,char *pat1,char *pat2,Recycler *recycler)

{
  Type *local_38;
  int local_2c;
  int k;
  Recycler *recycler_local;
  char *pat2_local;
  char *pat1_local;
  TrigramInfo *this_local;
  
  local_38 = this->cachedResult;
  do {
    Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierPtr(local_38);
    local_38 = local_38 + 1;
  } while ((TrigramInfo *)local_38 != this + 1);
  this->isTrigramPattern = true;
  this->hasCachedResultString = false;
  this->triPat1 = 0;
  this->triPat2 = 0;
  this->resultCount = 0;
  for (local_2c = 3; local_2c < 8; local_2c = local_2c + 1) {
    this->triPat1 = this->triPat1 * 0x10 + (int)pat1[local_2c];
    this->triPat2 = this->triPat2 * 0x10 + (int)pat2[local_2c];
  }
  return;
}

Assistant:

TrigramInfo::TrigramInfo(__in_ecount(PatternLength) char* pat1,__in_ecount(PatternLength) char* pat2, Recycler* recycler)
    {
        isTrigramPattern=true;
        hasCachedResultString = false;

        int k;
        triPat1=0;
        triPat2=0;
        resultCount=0;
        for (k=3;k<PatternLength;k++) {
            triPat1=(triPat1<<4)+pat1[k];
            triPat2=(triPat2<<4)+pat2[k];
        }
    }